

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_ClassArray<ON_MappingRef>::Empty(ON_ClassArray<ON_MappingRef> *this)

{
  int local_14;
  int i;
  ON_ClassArray<ON_MappingRef> *this_local;
  
  local_14 = this->m_count;
  while (local_14 = local_14 + -1, -1 < local_14) {
    DestroyElement(this,this->m_a + local_14);
    memset(this->m_a + local_14,0,0x28);
    ConstructDefaultElement(this,this->m_a + local_14);
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}